

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O1

string * __thiscall
flatbuffers::dart::DartGenerator::GenStructObjectAPIUnpack_abi_cxx11_
          (string *__return_storage_ptr__,DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields)

{
  Value *value;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BaseType BVar2;
  FieldDef *def;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  size_type *psVar6;
  long *plVar7;
  char *pcVar8;
  undefined8 uVar9;
  _Alloc_hider _Var10;
  byte bVar11;
  pointer ppVar12;
  string offset;
  string defaultValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string nullableValueAccessOperator;
  string object_type;
  string constructor_args;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  IdlNamer *local_80;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  constructor_args._M_dataplus._M_p = (pointer)&constructor_args.field_2;
  constructor_args._M_string_length = 0;
  constructor_args.field_2._M_local_buf[0] = '\0';
  ppVar12 = (non_deprecated_fields->
            super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_78 = non_deprecated_fields;
  if (ppVar12 !=
      (non_deprecated_fields->
      super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_80 = &this->namer_;
    do {
      def = ppVar12->second;
      (*(local_80->super_Namer)._vptr_Namer[0x12])(&object_type,local_80,def);
      if (constructor_args._M_string_length != 0) {
        std::__cxx11::string::append((char *)&constructor_args);
      }
      std::operator+(&nullableValueAccessOperator,"      ",&object_type);
      plVar4 = (long *)std::__cxx11::string::append((char *)&nullableValueAccessOperator);
      defaultValue._M_dataplus._M_p = (pointer)&defaultValue.field_2;
      psVar6 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar6) {
        defaultValue.field_2._M_allocated_capacity = *psVar6;
        defaultValue.field_2._8_8_ = plVar4[3];
      }
      else {
        defaultValue.field_2._M_allocated_capacity = *psVar6;
        defaultValue._M_dataplus._M_p = (pointer)*plVar4;
      }
      defaultValue._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)&constructor_args,(ulong)defaultValue._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)defaultValue._M_dataplus._M_p != &defaultValue.field_2) {
        operator_delete(defaultValue._M_dataplus._M_p,defaultValue.field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)nullableValueAccessOperator._M_dataplus._M_p != &nullableValueAccessOperator.field_2) {
        operator_delete(nullableValueAccessOperator._M_dataplus._M_p,
                        nullableValueAccessOperator.field_2._M_allocated_capacity + 1);
      }
      value = &def->value;
      getDefaultValue_abi_cxx11_(&defaultValue,this,value);
      bVar11 = (struct_def->fixed ^ 1U) & defaultValue._M_string_length == 0;
      pcVar8 = "";
      if (bVar11 != 0) {
        pcVar8 = "?";
      }
      nullableValueAccessOperator._M_dataplus._M_p = (pointer)&nullableValueAccessOperator.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&nullableValueAccessOperator,pcVar8,pcVar8 + bVar11);
      BVar2 = (value->type).base_type;
      if (BVar2 == BASE_TYPE_VECTOR) {
        if ((def->value).type.element == BASE_TYPE_STRUCT) {
          std::operator+(&local_158,&object_type,&nullableValueAccessOperator);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_158);
          offset._M_dataplus._M_p = (pointer)&offset.field_2;
          psVar6 = (size_type *)(plVar4 + 2);
          if ((size_type *)*plVar4 == psVar6) {
            offset.field_2._M_allocated_capacity = *psVar6;
            offset.field_2._8_8_ = plVar4[3];
          }
          else {
            offset.field_2._M_allocated_capacity = *psVar6;
            offset._M_dataplus._M_p = (pointer)*plVar4;
          }
          offset._M_string_length = plVar4[1];
          *plVar4 = (long)psVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&constructor_args,(ulong)offset._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)offset._M_dataplus._M_p != &offset.field_2) {
            operator_delete(offset._M_dataplus._M_p,offset.field_2._M_allocated_capacity + 1);
          }
          uVar9 = local_158.field_2._M_allocated_capacity;
          _Var10._M_p = local_158._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) goto LAB_001d3ec3;
        }
        else {
          GenReaderTypeName_abi_cxx11_
                    (&offset,this,&value->type,(struct_def->super_Definition).defined_namespace,def,
                     false,false,true);
          std::__cxx11::string::_M_append((char *)&constructor_args,(ulong)offset._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)offset._M_dataplus._M_p != &offset.field_2) {
            operator_delete(offset._M_dataplus._M_p,offset.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&constructor_args);
          NumToString<unsigned_short>(&offset,(def->value).offset);
          if (bVar11 == 0) {
            std::operator+(&local_70,"(_bc, _bcOffset, ",&offset);
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
            local_c0 = &local_b0;
            plVar7 = plVar4 + 2;
            if ((long *)*plVar4 == plVar7) {
              local_b0 = *plVar7;
              lStack_a8 = plVar4[3];
            }
            else {
              local_b0 = *plVar7;
              local_c0 = (long *)*plVar4;
            }
            local_b8 = plVar4[1];
            *plVar4 = (long)plVar7;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_c0,(ulong)defaultValue._M_dataplus._M_p);
            local_a0 = &local_90;
            plVar7 = plVar4 + 2;
            if ((long *)*plVar4 == plVar7) {
              local_90 = *plVar7;
              lStack_88 = plVar4[3];
            }
            else {
              local_90 = *plVar7;
              local_a0 = (long *)*plVar4;
            }
            local_98 = plVar4[1];
            *plVar4 = (long)plVar7;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0);
          }
          else {
            std::operator+(&local_50,"Nullable(_bc, _bcOffset, ",&offset);
            puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
          }
          psVar6 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar6) {
            local_158.field_2._M_allocated_capacity = *psVar6;
            local_158.field_2._8_8_ = puVar5[3];
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar6;
            local_158._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_158._M_string_length = puVar5[1];
          *puVar5 = psVar6;
          puVar5[1] = 0;
          *(undefined1 *)psVar6 = 0;
          std::__cxx11::string::_M_append
                    ((char *)&constructor_args,(ulong)local_158._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if (bVar11 == 0) {
            if (local_a0 != &local_90) {
              operator_delete(local_a0,local_90 + 1);
            }
            if (local_c0 != &local_b0) {
              operator_delete(local_c0,local_b0 + 1);
            }
            uVar9 = local_70.field_2._M_allocated_capacity;
            _Var10._M_p = local_70._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_001d3ea8;
          }
          else {
            uVar9 = local_50.field_2._M_allocated_capacity;
            _Var10._M_p = local_50._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_001d3ea8:
              operator_delete(_Var10._M_p,uVar9 + 1);
            }
          }
          uVar9 = offset.field_2._M_allocated_capacity;
          _Var10._M_p = offset._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)offset._M_dataplus._M_p != &offset.field_2) goto LAB_001d3ec3;
        }
      }
      else if (BVar2 == BASE_TYPE_STRUCT) {
        std::operator+(&local_158,&object_type,&nullableValueAccessOperator);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_158);
        offset._M_dataplus._M_p = (pointer)&offset.field_2;
        psVar6 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar6) {
          offset.field_2._M_allocated_capacity = *psVar6;
          offset.field_2._8_8_ = plVar4[3];
        }
        else {
          offset.field_2._M_allocated_capacity = *psVar6;
          offset._M_dataplus._M_p = (pointer)*plVar4;
        }
        offset._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&constructor_args,(ulong)offset._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)offset._M_dataplus._M_p != &offset.field_2) {
          operator_delete(offset._M_dataplus._M_p,offset.field_2._M_allocated_capacity + 1);
        }
        uVar9 = local_158.field_2._M_allocated_capacity;
        _Var10._M_p = local_158._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
LAB_001d3ec3:
          operator_delete(_Var10._M_p,uVar9 + 1);
        }
      }
      else {
        std::__cxx11::string::_M_append
                  ((char *)&constructor_args,(ulong)object_type._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)nullableValueAccessOperator._M_dataplus._M_p != &nullableValueAccessOperator.field_2) {
        operator_delete(nullableValueAccessOperator._M_dataplus._M_p,
                        nullableValueAccessOperator.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)defaultValue._M_dataplus._M_p != &defaultValue.field_2) {
        operator_delete(defaultValue._M_dataplus._M_p,defaultValue.field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)object_type._M_dataplus._M_p != &object_type.field_2) {
        operator_delete(object_type._M_dataplus._M_p,object_type.field_2._M_allocated_capacity + 1);
      }
      ppVar12 = ppVar12 + 1;
    } while (ppVar12 !=
             (local_78->
             super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  (*(this->namer_).super_Namer._vptr_Namer[0x11])(&object_type,&this->namer_,struct_def);
  std::operator+(&offset,"  ",&object_type);
  plVar4 = (long *)std::__cxx11::string::append((char *)&offset);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    nullableValueAccessOperator.field_2._M_allocated_capacity = *psVar6;
    nullableValueAccessOperator.field_2._8_8_ = plVar4[3];
    nullableValueAccessOperator._M_dataplus._M_p = (pointer)&nullableValueAccessOperator.field_2;
  }
  else {
    nullableValueAccessOperator.field_2._M_allocated_capacity = *psVar6;
    nullableValueAccessOperator._M_dataplus._M_p = (pointer)*plVar4;
  }
  nullableValueAccessOperator._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&nullableValueAccessOperator,
                              (ulong)object_type._M_dataplus._M_p);
  paVar1 = &defaultValue.field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    defaultValue.field_2._M_allocated_capacity = *psVar6;
    defaultValue.field_2._8_8_ = plVar4[3];
    defaultValue._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    defaultValue.field_2._M_allocated_capacity = *psVar6;
    defaultValue._M_dataplus._M_p = (pointer)*plVar4;
  }
  defaultValue._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&defaultValue);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    lVar3 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)defaultValue._M_dataplus._M_p != paVar1) {
    operator_delete(defaultValue._M_dataplus._M_p,defaultValue.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nullableValueAccessOperator._M_dataplus._M_p != &nullableValueAccessOperator.field_2) {
    operator_delete(nullableValueAccessOperator._M_dataplus._M_p,
                    nullableValueAccessOperator.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)offset._M_dataplus._M_p != &offset.field_2) {
    operator_delete(offset._M_dataplus._M_p,offset.field_2._M_allocated_capacity + 1);
  }
  if (constructor_args._M_string_length != 0) {
    std::operator+(&defaultValue,"\n",&constructor_args);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)defaultValue._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)defaultValue._M_dataplus._M_p != paVar1) {
      operator_delete(defaultValue._M_dataplus._M_p,defaultValue.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)object_type._M_dataplus._M_p != &object_type.field_2) {
    operator_delete(object_type._M_dataplus._M_p,object_type.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)constructor_args._M_dataplus._M_p != &constructor_args.field_2) {
    operator_delete(constructor_args._M_dataplus._M_p,
                    CONCAT71(constructor_args.field_2._M_allocated_capacity._1_7_,
                             constructor_args.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenStructObjectAPIUnpack(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields) {
    std::string constructor_args;
    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const FieldDef &field = *it->second;

      const std::string field_name = namer_.Field(field);
      if (!constructor_args.empty()) constructor_args += ",\n";
      constructor_args += "      " + field_name + ": ";

      const Type &type = field.value.type;
      std::string defaultValue = getDefaultValue(field.value);
      bool isNullable = defaultValue.empty() && !struct_def.fixed;
      std::string nullableValueAccessOperator = isNullable ? "?" : "";
      if (type.base_type == BASE_TYPE_STRUCT) {
        constructor_args +=
            field_name + nullableValueAccessOperator + ".unpack()";
      } else if (type.base_type == BASE_TYPE_VECTOR) {
        if (type.VectorType().base_type == BASE_TYPE_STRUCT) {
          constructor_args += field_name + nullableValueAccessOperator +
                              ".map((e) => e.unpack()).toList()";
        } else {
          constructor_args +=
              GenReaderTypeName(field.value.type, struct_def.defined_namespace,
                                field, false, false);
          constructor_args += ".vTableGet";
          std::string offset = NumToString(field.value.offset);
          constructor_args +=
              isNullable
                  ? "Nullable(_bc, _bcOffset, " + offset + ")"
                  : "(_bc, _bcOffset, " + offset + ", " + defaultValue + ")";
        }
      } else {
        constructor_args += field_name;
      }
    }

    const std::string object_type = namer_.ObjectType(struct_def);
    std::string code = "  " + object_type + " unpack() => " + object_type + "(";
    if (!constructor_args.empty()) code += "\n" + constructor_args;
    code += ");\n";
    return code;
  }